

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Mtbdd __thiscall sylvan::Mtbdd::AbstractMin(Mtbdd *this,BddSet *variables)

{
  MTBDD MVar1;
  MTBDD *in_RDX;
  
  MVar1 = mtbdd_abstract_RUN((variables->set).bdd,*in_RDX,mtbdd_abstract_op_min_CALL);
  this->mtbdd = MVar1;
  mtbdd_protect(&this->mtbdd);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::AbstractMin(const BddSet &variables) const
{
    return mtbdd_abstract_min(mtbdd, variables.set.bdd);
}